

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenshtein_distance_test.cc
# Opt level: O0

void __thiscall LDISTANCE_TEST_Find_Test::~LDISTANCE_TEST_Find_Test(LDISTANCE_TEST_Find_Test *this)

{
  void *in_RDI;
  
  ~LDISTANCE_TEST_Find_Test((LDISTANCE_TEST_Find_Test *)0x13aed8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(LDISTANCE_TEST, Find) {
  StringList list;
  list.push_back("alex");
  list.push_back("apple");
  list.push_back("mac");
  StrSimilar ss;
  EXPECT_EQ(ss.Find(std::string("alex"), list), true);
  EXPECT_EQ(ss.Find(std::string("apple"), list), true);
  EXPECT_EQ(ss.Find(std::string("mac"), list), true);
  EXPECT_EQ(ss.Find(std::string("zz"), list), false);
}